

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::Incomplete2DSizeCase::Incomplete2DSizeCase
          (Incomplete2DSizeCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,IVec2 *size,IVec2 *invalidLevelSize,int invalidLevelNdx,
          ContextInfo *ctxInfo)

{
  Tex2DCompletenessCase::Tex2DCompletenessCase
            (&this->super_Tex2DCompletenessCase,testCtx,renderCtx,name,description);
  (this->super_Tex2DCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e1afe0;
  *(int *)&(this->super_Tex2DCompletenessCase).field_0x84 = invalidLevelNdx;
  tcu::Vector<int,_2>::Vector(&this->m_invalidLevelSize,invalidLevelSize);
  this->m_ctxInfo = ctxInfo;
  tcu::Vector<int,_2>::Vector(&this->m_size,size);
  return;
}

Assistant:

Incomplete2DSizeCase::Incomplete2DSizeCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, IVec2 invalidLevelSize, int invalidLevelNdx, const glu::ContextInfo& ctxInfo)
	: Tex2DCompletenessCase		(testCtx, renderCtx, name, description)
	, m_invalidLevelNdx			(invalidLevelNdx)
	, m_invalidLevelSize		(invalidLevelSize)
	, m_ctxInfo					(ctxInfo)
	, m_size					(size)
{
}